

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O3

void __thiscall ADynamicLight::LinkLight(ADynamicLight *this)

{
  double dVar1;
  subsector_t *subSec;
  FLightNode *pFVar2;
  FLightNode *pFVar3;
  DVector3 local_28;
  
  pFVar2 = this->touching_sides;
  for (pFVar3 = pFVar2; pFVar3 != (FLightNode *)0x0; pFVar3 = pFVar3->nextTarget) {
    pFVar3->lightsource = (ADynamicLight *)0x0;
  }
  for (pFVar3 = this->touching_subsectors; pFVar3 != (FLightNode *)0x0; pFVar3 = pFVar3->nextTarget)
  {
    pFVar3->lightsource = (ADynamicLight *)0x0;
  }
  for (pFVar3 = this->touching_sector; pFVar3 != (FLightNode *)0x0; pFVar3 = pFVar3->nextTarget) {
    pFVar3->lightsource = (ADynamicLight *)0x0;
  }
  if (0.0 < (this->super_AActor).radius) {
    subSec = R_PointInSubsector(SUB84((this->super_AActor).__Pos.X + 103079215104.0,0),
                                SUB84((this->super_AActor).__Pos.Y + 103079215104.0,0));
    validcount = validcount + 1;
    local_28.X = (this->super_AActor).__Pos.X;
    local_28.Y = (this->super_AActor).__Pos.Y;
    local_28.Z = (this->super_AActor).__Pos.Z;
    dVar1 = (this->super_AActor).radius;
    CollectWithinRadius(this,&local_28,subSec,(float)(dVar1 * dVar1));
    pFVar2 = this->touching_sides;
  }
  while (pFVar2 != (FLightNode *)0x0) {
    if (pFVar2->lightsource == (ADynamicLight *)0x0) {
      pFVar2 = DeleteLightNode(pFVar2);
    }
    else {
      pFVar2 = pFVar2->nextTarget;
    }
  }
  pFVar2 = this->touching_subsectors;
  while (pFVar2 != (FLightNode *)0x0) {
    if (pFVar2->lightsource == (ADynamicLight *)0x0) {
      pFVar2 = DeleteLightNode(pFVar2);
    }
    else {
      pFVar2 = pFVar2->nextTarget;
    }
  }
  pFVar2 = this->touching_sector;
  while (pFVar2 != (FLightNode *)0x0) {
    if (pFVar2->lightsource == (ADynamicLight *)0x0) {
      pFVar2 = DeleteLightNode(pFVar2);
    }
    else {
      pFVar2 = pFVar2->nextTarget;
    }
  }
  return;
}

Assistant:

void ADynamicLight::LinkLight()
{
	// mark the old light nodes
	FLightNode * node;
	
	node = touching_sides;
	while (node)
    {
		node->lightsource = NULL;
		node = node->nextTarget;
    }
	node = touching_subsectors;
	while (node)
    {
		node->lightsource = NULL;
		node = node->nextTarget;
    }
	node = touching_sector;
	while (node)
	{
		node->lightsource = NULL;
		node = node->nextTarget;
	}

	if (radius>0)
	{
		// passing in radius*radius allows us to do a distance check without any calls to sqrt
		subsector_t * subSec = R_PointInSubsector(Pos());
		::validcount++;
		CollectWithinRadius(Pos(), subSec, radius*radius);

	}
		
	// Now delete any nodes that won't be used. These are the ones where
	// m_thing is still NULL.
	
	node = touching_sides;
	while (node)
	{
		if (node->lightsource == NULL)
		{
			node = DeleteLightNode(node);
		}
		else
			node = node->nextTarget;
	}

	node = touching_subsectors;
	while (node)
	{
		if (node->lightsource == NULL)
		{
			node = DeleteLightNode(node);
		}
		else
			node = node->nextTarget;
	}

	node = touching_sector;
	while (node)
	{
		if (node->lightsource == NULL)
		{
			node = DeleteLightNode(node);
		}
		else
			node = node->nextTarget;
	}
}